

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

PNode * heap_pop(VecPNode *a)

{
  PNode **ppPVar1;
  PNode *pPVar2;
  uint uVar3;
  
  if (a->n == 0) {
    pPVar2 = (PNode *)0x0;
  }
  else {
    ppPVar1 = a->v;
    pPVar2 = *ppPVar1;
    uVar3 = a->n - 1;
    *ppPVar1 = ppPVar1[uVar3];
    a->n = uVar3;
    uVar3 = uVar3 >> 1;
    while (0 < (int)uVar3) {
      uVar3 = uVar3 - 1;
      heapify(a,uVar3);
    }
  }
  return pPVar2;
}

Assistant:

PNode *heap_pop(VecPNode *a) {
  if (a->n == 0) return NULL;
  PNode *pn = a->v[0];
  a->v[0] = a->v[a->n -1];
  a->n--;
  for (int i = a->n / 2 - 1; i >= 0; i--)
    heapify(a, i);
  return pn;
}